

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O3

int __thiscall Wave::get_min_entropy(Wave *this,minstd_rand *gen)

{
  double dVar1;
  uint uVar2;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double local_38;
  
  iVar3 = -2;
  if (this->is_impossible == false) {
    uVar2 = this->size;
    if (uVar2 == 0) {
      iVar3 = -1;
    }
    else {
      dVar1 = this->min_abs_half_plogp;
      uVar4 = 0xffffffff;
      local_38 = INFINITY;
      uVar5 = 0;
      do {
        if (((this->memoisation).nb_patterns.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5] != 1) &&
           (dVar7 = (this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar5], dVar7 <= local_38)) {
          dVar6 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                            (gen);
          dVar7 = dVar7 + dVar6 * dVar1 + 0.0;
          if (dVar7 < local_38) {
            uVar4 = uVar5 & 0xffffffff;
            local_38 = dVar7;
          }
          uVar2 = this->size;
        }
        iVar3 = (int)uVar4;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
    }
  }
  return iVar3;
}

Assistant:

int Wave::get_min_entropy(std::minstd_rand &gen) const noexcept {
  if (is_impossible) {
    return -2;
  }

  std::uniform_real_distribution<> dis(0, min_abs_half_plogp);

  // The minimum entropy (plus a small noise)
  double min = std::numeric_limits<double>::infinity();
  int argmin = -1;

  for (unsigned i = 0; i < size; i++) {

    // If the cell is decided, we do not compute the entropy (which is equal
    // to 0).
    double nb_patterns_local = memoisation.nb_patterns[i];
    if (nb_patterns_local == 1) {
      continue;
    }

    // Otherwise, we take the memoised entropy.
    double entropy = memoisation.entropy[i];

    // We first check if the entropy is less than the minimum.
    // This is important to reduce noise computation (which is not
    // negligible).
    if (entropy <= min) {

      // Then, we add noise to decide randomly which will be chosen.
      // noise is smaller than the smallest p * log(p), so the minimum entropy
      // will always be chosen.
      double noise = dis(gen);
      if (entropy + noise < min) {
        min = entropy + noise;
        argmin = i;
      }
    }
  }

  return argmin;
}